

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::PipelineStateGLImpl
          (PipelineStateGLImpl *this,IReferenceCounters *pRefCounters,RenderDeviceGLImpl *pDeviceGL,
          GraphicsPipelineStateCreateInfo *CreateInfo,bool bIsDeviceInternal)

{
  PipelineBuilderBase *pPVar1;
  _Alloc_hider _Var2;
  PIPELINE_STATE_STATUS PVar3;
  TShaderStages *Args_1;
  RefCntAutoPtr<Diligent::ShaderGLImpl> pTempPS;
  TShaderStages Shaders;
  DoublePtrHelper<Diligent::IShader> local_d8;
  string msg;
  
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  PipelineStateBase<Diligent::GraphicsPipelineStateCreateInfo>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,pRefCounters,pDeviceGL,
             CreateInfo,bIsDeviceInternal);
  (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
  .super_ObjectBase<Diligent::IPipelineStateGL>.super_RefCountedObject<Diligent::IPipelineStateGL>.
  super_IPipelineStateGL.super_IPipelineState.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00a564c0;
  this->m_GLPrograms = (SharedGLProgramPtr *)0x0;
  (this->m_ProgPipelineLock).m_IsLocked._M_base._M_i = false;
  (this->m_GLProgPipelines).
  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_GLProgPipelines).
  super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_GLProgPipelines).
           super__Vector_base<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>,_std::allocator<std::pair<__GLXcontextRec_*,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLPipelineObjCreateReleaseHelper>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  this->m_ShaderTypes = (SHADER_TYPE *)0x0;
  this->m_BaseBindings = (TBindings *)0x0;
  (this->m_Builder)._M_t.
  super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>._M_head_impl =
       (PipelineBuilderBase *)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderResources).
  super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ShaderNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ResourceAttibutions).
  super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Shaders.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Shaders.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Shaders.super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PipelineStateBase<Diligent::EngineGLImplTraits>::
  ExtractShaders<Diligent::ShaderGLImpl,Diligent::GraphicsPipelineStateCreateInfo,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,CreateInfo,&Shaders,false)
  ;
  pTempPS.m_pObject = (ShaderGLImpl *)0x0;
  if (CreateInfo->pPS == (IShader *)0x0) {
    msg.field_2._8_8_ = 0;
    msg._M_dataplus._M_p = (pointer)0x0;
    msg._M_string_length = 0;
    msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7081e9;
    local_d8.NewRawPtr = (IShader *)0x0;
    local_d8.m_pAutoPtr = &pTempPS;
    RenderDeviceGLImpl::CreateShader
              (pDeviceGL,(ShaderCreateInfo *)&msg,&local_d8.NewRawPtr,(IDataBlob **)0x0);
    RefCntAutoPtr<Diligent::ShaderGLImpl>::DoublePtrHelper<Diligent::IShader>::~DoublePtrHelper
              (&local_d8);
    std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>::
    emplace_back<Diligent::RefCntAutoPtr<Diligent::ShaderGLImpl>&>
              ((vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>> *)&Shaders,
               &pTempPS);
  }
  Args_1 = &Shaders;
  std::
  make_unique<Diligent::PipelineStateGLImpl::PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,Diligent::GraphicsPipelineStateCreateInfoX>,Diligent::PipelineStateGLImpl&,Diligent::GraphicsPipelineStateCreateInfo_const&,std::vector<Diligent::ShaderGLImpl*,std::allocator<Diligent::ShaderGLImpl*>>>
            ((PipelineStateGLImpl *)&msg,(GraphicsPipelineStateCreateInfo *)this,
             (vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_> *)
             CreateInfo);
  _Var2 = msg._M_dataplus;
  msg._M_dataplus._M_p = (pointer)0x0;
  pPVar1 = (this->m_Builder)._M_t.
           super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
           .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>.
           _M_head_impl;
  (this->m_Builder)._M_t.
  super___uniq_ptr_impl<Diligent::PipelineStateGLImpl::PipelineBuilderBase,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  ._M_t.
  super__Tuple_impl<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_std::default_delete<Diligent::PipelineStateGLImpl::PipelineBuilderBase>_>
  .super__Head_base<0UL,_Diligent::PipelineStateGLImpl::PipelineBuilderBase_*,_false>._M_head_impl =
       (PipelineBuilderBase *)_Var2._M_p;
  if (pPVar1 != (PipelineBuilderBase *)0x0) {
    (*pPVar1->_vptr_PipelineBuilderBase[1])();
    if (msg._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)msg._M_dataplus._M_p + 8))();
    }
  }
  PVar3 = GetStatus(this,((CreateInfo->super_PipelineStateCreateInfo).Flags &
                         PSO_CREATE_FLAG_ASYNCHRONOUS) == PSO_CREATE_FLAG_NONE);
  if ((PVar3 != PIPELINE_STATE_STATUS_READY) &&
     (((CreateInfo->super_PipelineStateCreateInfo).Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) ==
      PSO_CREATE_FLAG_NONE)) {
    FormatString<char[26],char[96]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0"
               ,(char (*) [96])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PipelineStateGLImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x20a);
    std::__cxx11::string::~string((string *)&msg);
  }
  RefCntAutoPtr<Diligent::ShaderGLImpl>::Release(&pTempPS);
  std::_Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
  ~_Vector_base(&Shaders.
                 super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               );
  return;
}

Assistant:

PipelineStateGLImpl::PipelineStateGLImpl(IReferenceCounters*                    pRefCounters,
                                         RenderDeviceGLImpl*                    pDeviceGL,
                                         const GraphicsPipelineStateCreateInfo& CreateInfo,
                                         bool                                   bIsDeviceInternal) :
    // clang-format off
    TPipelineStateBase
    {
        pRefCounters,
        pDeviceGL,
        CreateInfo,
        bIsDeviceInternal
    }
// clang-format on
{
    try
    {
        TShaderStages Shaders;
        ExtractShaders<ShaderGLImpl>(CreateInfo, Shaders);

        RefCntAutoPtr<ShaderGLImpl> pTempPS;
        if (CreateInfo.pPS == nullptr)
        {
            // Some OpenGL implementations fail if fragment shader is not present, so
            // create a dummy one.
            ShaderCreateInfo ShaderCI;
            ShaderCI.SourceLanguage  = SHADER_SOURCE_LANGUAGE_GLSL;
            ShaderCI.Source          = "void main(){}";
            ShaderCI.Desc.ShaderType = SHADER_TYPE_PIXEL;
            ShaderCI.Desc.Name       = "Dummy fragment shader";
            pDeviceGL->CreateShader(ShaderCI, pTempPS.DblPtr<IShader>(), nullptr);

            Shaders.emplace_back(pTempPS);
        }

        m_Builder = std::make_unique<PipelineBuilder<GraphicsPipelineStateCreateInfo, GraphicsPipelineStateCreateInfoX>>(*this, CreateInfo, std::move(Shaders));

        // Force builder tick
        PIPELINE_STATE_STATUS Status = GetStatus(/*WaitForCompletion = */ (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) == 0);
        VERIFY_EXPR(Status == PIPELINE_STATE_STATUS_READY || (CreateInfo.Flags & PSO_CREATE_FLAG_ASYNCHRONOUS) != 0);
    }
    catch (...)
    {
        Destruct();
        throw;
    }
}